

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c
# Opt level: O3

void upb_Arena_Free(upb_Arena *a)

{
  long *plVar1;
  upb_Arena *puVar2;
  upb_Arena *puVar3;
  undefined8 *puVar4;
  long *plVar5;
  upb_Arena *puVar6;
  code *pcVar7;
  bool bVar8;
  
  puVar3 = (upb_Arena *)a[2].ptr_dont_copy_me__upb_internal_use_only;
  puVar6 = a + 1;
  while( true ) {
    while (puVar2 = puVar3, ((ulong)puVar2 & 1) == 0) {
      puVar6 = puVar2;
      puVar3 = (upb_Arena *)puVar2[1].ptr_dont_copy_me__upb_internal_use_only;
    }
    if (puVar2 == (upb_Arena *)0x3) break;
    LOCK();
    puVar3 = (upb_Arena *)puVar6[1].ptr_dont_copy_me__upb_internal_use_only;
    bVar8 = puVar2 == puVar3;
    if (bVar8) {
      puVar6[1].ptr_dont_copy_me__upb_internal_use_only =
           (char *)((long)&puVar2[-1].end_dont_copy_me__upb_internal_use_only + 6);
      puVar3 = puVar2;
    }
    UNLOCK();
    if (bVar8) {
      return;
    }
  }
  if (((ulong)puVar6[1].ptr_dont_copy_me__upb_internal_use_only & 1) == 0) {
    __assert_fail("_upb_Arena_IsTaggedRefcount(parent_or_count)",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/mem/arena.c"
                  ,0x70,"uintptr_t _upb_Arena_RefCountFromTagged(uintptr_t)");
  }
  if (((ulong)puVar6[1].ptr_dont_copy_me__upb_internal_use_only & 0xfffffffffffffffe) == 2) {
    do {
      puVar3 = (upb_Arena *)puVar6[1].end_dont_copy_me__upb_internal_use_only;
      plVar5 = (long *)puVar6[2].end_dont_copy_me__upb_internal_use_only;
      puVar4 = (undefined8 *)
               ((ulong)puVar6->ptr_dont_copy_me__upb_internal_use_only & 0xfffffffffffffffe);
      if (plVar5 == (long *)0x0) {
        pcVar7 = (code *)puVar6->end_dont_copy_me__upb_internal_use_only;
      }
      else {
        if (*plVar5 != 0) {
          plVar5[1] = (long)puVar6[-1].end_dont_copy_me__upb_internal_use_only - (long)plVar5;
        }
        if (puVar4 == (undefined8 *)0x0) {
          __assert_fail("alloc",
                        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/mem/alloc.h"
                        ,0x36,"void upb_free_sized(upb_alloc *, void *, size_t)");
        }
        pcVar7 = (code *)puVar6->end_dont_copy_me__upb_internal_use_only;
        do {
          plVar1 = (long *)*plVar5;
          (*(code *)*puVar4)(puVar4,plVar5,plVar5[1],0);
          plVar5 = plVar1;
        } while (plVar1 != (long *)0x0);
      }
      if (pcVar7 != (code *)0x0) {
        (*pcVar7)(puVar4);
      }
      puVar6 = puVar3;
    } while (puVar3 != (upb_Arena *)0x0);
    return;
  }
  __assert_fail("_upb_Arena_RefCountFromTagged(ai->parent_or_count) == 1",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/mem/arena.c"
                ,0x1d8,"void _upb_Arena_DoFree(upb_ArenaInternal *)");
}

Assistant:

void upb_Arena_Free(upb_Arena* a) {
  upb_ArenaInternal* ai = upb_Arena_Internal(a);
  // Cannot be replaced with _upb_Arena_FindRoot, as that provides only a
  // relaxed read of the refcount if ai is already the root.
  uintptr_t poc = upb_Atomic_Load(&ai->parent_or_count, memory_order_acquire);
retry:
  while (_upb_Arena_IsTaggedPointer(poc)) {
    ai = _upb_Arena_PointerFromTagged(poc);
    UPB_TSAN_CHECK_PUBLISHED(ai);
    poc = upb_Atomic_Load(&ai->parent_or_count, memory_order_acquire);
  }

  // compare_exchange or fetch_sub are RMW operations, which are more
  // expensive then direct loads.  As an optimization, we only do RMW ops
  // when we need to update things for other threads to see.
  if (poc == _upb_Arena_TaggedFromRefcount(1)) {
#ifdef UPB_TRACING_ENABLED
    upb_Arena_LogFree(a);
#endif
    _upb_Arena_DoFree(ai);
    return;
  }

  if (upb_Atomic_CompareExchangeWeak(
          &ai->parent_or_count, &poc,
          _upb_Arena_TaggedFromRefcount(_upb_Arena_RefCountFromTagged(poc) - 1),
          memory_order_release, memory_order_acquire)) {
    // We were >1 and we decremented it successfully, so we are done.
    return;
  }

  // We failed our update, so someone has done something, retry the whole
  // process, but the failed exchange reloaded `poc` for us.
  goto retry;
}